

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

int llvm::APInt::tcCompare(WordType *lhs,WordType *rhs,uint parts)

{
  uint local_24;
  uint parts_local;
  WordType *rhs_local;
  WordType *lhs_local;
  
  local_24 = parts;
  do {
    if (local_24 == 0) {
      return 0;
    }
    local_24 = local_24 - 1;
  } while (lhs[local_24] == rhs[local_24]);
  lhs_local._4_4_ = -1;
  if (rhs[local_24] < lhs[local_24]) {
    lhs_local._4_4_ = 1;
  }
  return lhs_local._4_4_;
}

Assistant:

int APInt::tcCompare(const WordType *lhs, const WordType *rhs,
                     unsigned parts) {
  while (parts) {
    parts--;
    if (lhs[parts] != rhs[parts])
      return (lhs[parts] > rhs[parts]) ? 1 : -1;
  }

  return 0;
}